

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Eltwise_x86_avx2::forward
          (Eltwise_x86_avx2 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  pointer pMVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Mat *m;
  Mat *this_00;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  size_t sVar14;
  void *pvVar15;
  size_t sVar16;
  size_t sVar17;
  void *pvVar18;
  _func_int *p_Var19;
  _func_int **pp_Var20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  pointer pMVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar43 [64];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar27 = m->elempack;
  uVar8 = m->c;
  uVar25 = (ulong)uVar8;
  iVar31 = m->h * m->w;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep != 0) {
    iVar9 = *(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx2[-3]);
    if (iVar27 == 4) {
      if (iVar9 == 0) {
        if (0 < (int)uVar8) {
          pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar23 = 0;
          do {
            if (0 < iVar31) {
              sVar10 = this_00->cstep;
              sVar11 = pMVar24[1].cstep;
              sVar12 = this_00->elemsize;
              pvVar13 = this_00->data;
              sVar14 = pMVar24[1].elemsize;
              pvVar15 = pMVar24[1].data;
              sVar16 = m->cstep;
              sVar17 = m->elemsize;
              pvVar18 = m->data;
              lVar29 = 0;
              iVar27 = iVar31;
              do {
                pfVar1 = (float *)((long)pvVar15 + lVar29 + sVar11 * sVar14 * uVar23);
                pfVar2 = (float *)((long)pvVar18 + lVar29 + sVar16 * sVar17 * uVar23);
                auVar32._0_4_ = *pfVar1 * *pfVar2;
                auVar32._4_4_ = pfVar1[1] * pfVar2[1];
                auVar32._8_4_ = pfVar1[2] * pfVar2[2];
                auVar32._12_4_ = pfVar1[3] * pfVar2[3];
                *(undefined1 (*) [16])((long)pvVar13 + lVar29 + sVar10 * sVar12 * uVar23) = auVar32;
                lVar29 = lVar29 + 0x10;
                iVar27 = iVar27 + -1;
              } while (iVar27 != 0);
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar25);
        }
        pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar24 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar23 = 2;
          do {
            if (0 < (int)uVar8) {
              pMVar24 = pMVar24 + uVar23;
              uVar26 = 0;
              do {
                if (0 < iVar31) {
                  lVar29 = this_00->cstep * this_00->elemsize * uVar26;
                  pvVar13 = this_00->data;
                  sVar10 = pMVar24->cstep;
                  sVar11 = pMVar24->elemsize;
                  pvVar15 = pMVar24->data;
                  lVar30 = 0;
                  iVar27 = iVar31;
                  do {
                    pfVar1 = (float *)((long)pvVar15 + lVar30 + sVar10 * sVar11 * uVar26);
                    pfVar2 = (float *)((long)pvVar13 + lVar30 + lVar29);
                    auVar33._0_4_ = *pfVar1 * *pfVar2;
                    auVar33._4_4_ = pfVar1[1] * pfVar2[1];
                    auVar33._8_4_ = pfVar1[2] * pfVar2[2];
                    auVar33._12_4_ = pfVar1[3] * pfVar2[3];
                    *(undefined1 (*) [16])((long)pvVar13 + lVar30 + lVar29) = auVar33;
                    lVar30 = lVar30 + 0x10;
                    iVar27 = iVar27 + -1;
                  } while (iVar27 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar25);
            }
            uVar23 = uVar23 + 1;
            pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar23 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar24 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      p_Var19 = this->_vptr_Eltwise_x86_avx2[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var19) == 1) {
        pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(int *)(&this->field_0x104 + (long)p_Var19) == 0) {
          if (0 < (int)uVar8) {
            uVar23 = 0;
            do {
              if (0 < iVar31) {
                sVar10 = this_00->cstep;
                sVar11 = pMVar24[1].cstep;
                sVar12 = this_00->elemsize;
                pvVar13 = this_00->data;
                sVar14 = pMVar24[1].elemsize;
                pvVar15 = pMVar24[1].data;
                sVar16 = m->cstep;
                sVar17 = m->elemsize;
                pvVar18 = m->data;
                lVar29 = 0;
                iVar27 = iVar31;
                do {
                  pfVar1 = (float *)((long)pvVar15 + lVar29 + sVar11 * sVar14 * uVar23);
                  pfVar2 = (float *)((long)pvVar18 + lVar29 + sVar16 * sVar17 * uVar23);
                  auVar35._0_4_ = *pfVar1 + *pfVar2;
                  auVar35._4_4_ = pfVar1[1] + pfVar2[1];
                  auVar35._8_4_ = pfVar1[2] + pfVar2[2];
                  auVar35._12_4_ = pfVar1[3] + pfVar2[3];
                  *(undefined1 (*) [16])((long)pvVar13 + lVar29 + sVar10 * sVar12 * uVar23) =
                       auVar35;
                  lVar29 = lVar29 + 0x10;
                  iVar27 = iVar27 + -1;
                } while (iVar27 != 0);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar25);
          }
          pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (2 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar24 >> 3) *
                         -0x71c71c71c71c71c7)) {
            uVar23 = 2;
            do {
              if (0 < (int)uVar8) {
                pMVar24 = pMVar24 + uVar23;
                uVar26 = 0;
                do {
                  if (0 < iVar31) {
                    lVar29 = this_00->cstep * this_00->elemsize * uVar26;
                    pvVar13 = this_00->data;
                    sVar10 = pMVar24->cstep;
                    sVar11 = pMVar24->elemsize;
                    pvVar15 = pMVar24->data;
                    lVar30 = 0;
                    iVar27 = iVar31;
                    do {
                      pfVar1 = (float *)((long)pvVar15 + lVar30 + sVar10 * sVar11 * uVar26);
                      pfVar2 = (float *)((long)pvVar13 + lVar30 + lVar29);
                      auVar36._0_4_ = *pfVar1 + *pfVar2;
                      auVar36._4_4_ = pfVar1[1] + pfVar2[1];
                      auVar36._8_4_ = pfVar1[2] + pfVar2[2];
                      auVar36._12_4_ = pfVar1[3] + pfVar2[3];
                      *(undefined1 (*) [16])((long)pvVar13 + lVar30 + lVar29) = auVar36;
                      lVar30 = lVar30 + 0x10;
                      iVar27 = iVar27 + -1;
                    } while (iVar27 != 0);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar25);
              }
              uVar23 = uVar23 + 1;
              pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            } while (uVar23 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar24 >> 3) * -0x71c71c71c71c71c7));
          }
        }
        else {
          if (0 < (int)uVar8) {
            fVar4 = **(float **)(&this->field_0xd8 + (long)p_Var19);
            fVar5 = (*(float **)(&this->field_0xd8 + (long)p_Var19))[1];
            auVar40._4_4_ = fVar5;
            auVar40._0_4_ = fVar5;
            auVar40._8_4_ = fVar5;
            auVar40._12_4_ = fVar5;
            uVar23 = 0;
            do {
              if (0 < iVar31) {
                sVar10 = this_00->cstep;
                sVar11 = pMVar24[1].cstep;
                sVar12 = this_00->elemsize;
                pvVar13 = this_00->data;
                sVar14 = pMVar24[1].elemsize;
                pvVar15 = pMVar24[1].data;
                sVar16 = m->cstep;
                sVar17 = m->elemsize;
                pvVar18 = m->data;
                lVar29 = 0;
                iVar27 = iVar31;
                do {
                  pfVar1 = (float *)((long)pvVar18 + lVar29 + sVar16 * sVar17 * uVar23);
                  auVar42._0_4_ = fVar4 * *pfVar1;
                  auVar42._4_4_ = fVar4 * pfVar1[1];
                  auVar42._8_4_ = fVar4 * pfVar1[2];
                  auVar42._12_4_ = fVar4 * pfVar1[3];
                  auVar32 = vfmadd231ps_fma(auVar42,auVar40,
                                            *(undefined1 (*) [16])
                                             ((long)pvVar15 + lVar29 + sVar11 * sVar14 * uVar23));
                  *(undefined1 (*) [16])((long)pvVar13 + lVar29 + sVar10 * sVar12 * uVar23) =
                       auVar32;
                  lVar29 = lVar29 + 0x10;
                  iVar27 = iVar27 + -1;
                } while (iVar27 != 0);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar25);
          }
          pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (2 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar24 >> 3) *
                         -0x71c71c71c71c71c7)) {
            pp_Var20 = this->_vptr_Eltwise_x86_avx2;
            uVar23 = 2;
            do {
              if (0 < (int)uVar8) {
                pMVar24 = pMVar24 + uVar23;
                uVar6 = *(undefined4 *)
                         (*(long *)(&this->field_0xd8 + (long)pp_Var20[-3]) + uVar23 * 4);
                auVar34._4_4_ = uVar6;
                auVar34._0_4_ = uVar6;
                auVar34._8_4_ = uVar6;
                auVar34._12_4_ = uVar6;
                uVar26 = 0;
                do {
                  if (0 < iVar31) {
                    lVar29 = this_00->cstep * this_00->elemsize * uVar26;
                    pvVar13 = this_00->data;
                    sVar10 = pMVar24->cstep;
                    sVar11 = pMVar24->elemsize;
                    pvVar15 = pMVar24->data;
                    lVar30 = 0;
                    iVar27 = iVar31;
                    do {
                      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                                 ((long)pvVar15 + lVar30 + sVar10 * sVar11 * uVar26)
                                                ,auVar34,*(undefined1 (*) [16])
                                                          ((long)pvVar13 + lVar30 + lVar29));
                      *(undefined1 (*) [16])((long)pvVar13 + lVar30 + lVar29) = auVar32;
                      lVar30 = lVar30 + 0x10;
                      iVar27 = iVar27 + -1;
                    } while (iVar27 != 0);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar25);
              }
              uVar23 = uVar23 + 1;
              pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            } while (uVar23 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar24 >> 3) * -0x71c71c71c71c71c7));
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx2[-3]) != 2) {
        return 0;
      }
      if (0 < (int)uVar8) {
        pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar23 = 0;
        do {
          if (0 < iVar31) {
            sVar10 = this_00->cstep;
            sVar11 = pMVar24[1].cstep;
            sVar12 = this_00->elemsize;
            pvVar13 = this_00->data;
            sVar14 = pMVar24[1].elemsize;
            pvVar15 = pMVar24[1].data;
            sVar16 = m->cstep;
            sVar17 = m->elemsize;
            pvVar18 = m->data;
            lVar29 = 0;
            iVar27 = iVar31;
            do {
              auVar32 = vmaxps_avx(*(undefined1 (*) [16])
                                    ((long)pvVar18 + lVar29 + sVar16 * sVar17 * uVar23),
                                   *(undefined1 (*) [16])
                                    ((long)pvVar15 + lVar29 + sVar11 * sVar14 * uVar23));
              *(undefined1 (*) [16])((long)pvVar13 + lVar29 + sVar10 * sVar12 * uVar23) = auVar32;
              lVar29 = lVar29 + 0x10;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar25);
      }
      pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar24 >> 3) *
                 -0x71c71c71c71c71c7) < 3) {
        return 0;
      }
      uVar23 = 2;
      do {
        if (0 < (int)uVar8) {
          pMVar24 = pMVar24 + uVar23;
          uVar26 = 0;
          do {
            if (0 < iVar31) {
              lVar29 = this_00->cstep * this_00->elemsize * uVar26;
              pvVar13 = this_00->data;
              sVar10 = pMVar24->cstep;
              sVar11 = pMVar24->elemsize;
              pvVar15 = pMVar24->data;
              lVar30 = 0;
              iVar27 = iVar31;
              do {
                auVar32 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar13 + lVar30 + lVar29),
                                     *(undefined1 (*) [16])
                                      ((long)pvVar15 + lVar30 + sVar10 * sVar11 * uVar26));
                *(undefined1 (*) [16])((long)pvVar13 + lVar30 + lVar29) = auVar32;
                lVar30 = lVar30 + 0x10;
                iVar27 = iVar27 + -1;
              } while (iVar27 != 0);
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar25);
        }
        uVar23 = uVar23 + 1;
        pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar23 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar24 >>
                                3) * -0x71c71c71c71c71c7));
    }
    else if (iVar27 == 8) {
      if (iVar9 == 0) {
        if (0 < (int)uVar8) {
          pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar23 = 0;
          do {
            if (0 < iVar31) {
              sVar10 = pMVar24[1].cstep;
              sVar11 = m->cstep;
              sVar12 = m->elemsize;
              pvVar13 = m->data;
              sVar14 = pMVar24[1].elemsize;
              pvVar15 = pMVar24[1].data;
              sVar16 = this_00->cstep;
              sVar17 = this_00->elemsize;
              pvVar18 = this_00->data;
              lVar29 = 0;
              iVar27 = iVar31;
              do {
                pfVar1 = (float *)((long)pvVar15 + lVar29 + sVar10 * sVar14 * uVar23);
                pfVar2 = (float *)((long)pvVar13 + lVar29 + sVar11 * sVar12 * uVar23);
                auVar21._4_4_ = pfVar1[1] * pfVar2[1];
                auVar21._0_4_ = *pfVar1 * *pfVar2;
                auVar21._8_4_ = pfVar1[2] * pfVar2[2];
                auVar21._12_4_ = pfVar1[3] * pfVar2[3];
                auVar21._16_4_ = pfVar1[4] * pfVar2[4];
                auVar21._20_4_ = pfVar1[5] * pfVar2[5];
                auVar21._24_4_ = pfVar1[6] * pfVar2[6];
                auVar21._28_4_ = pfVar1[7];
                *(undefined1 (*) [32])((long)pvVar18 + lVar29 + sVar16 * sVar17 * uVar23) = auVar21;
                lVar29 = lVar29 + 0x20;
                iVar27 = iVar27 + -1;
              } while (iVar27 != 0);
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar25);
        }
        pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar24 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar23 = 2;
          do {
            if (0 < (int)uVar8) {
              pMVar24 = pMVar24 + uVar23;
              uVar26 = 0;
              do {
                if (0 < iVar31) {
                  sVar10 = pMVar24->cstep;
                  sVar11 = pMVar24->elemsize;
                  pvVar13 = pMVar24->data;
                  lVar29 = this_00->cstep * this_00->elemsize * uVar26;
                  pvVar15 = this_00->data;
                  lVar30 = 0;
                  iVar27 = iVar31;
                  do {
                    pfVar1 = (float *)((long)pvVar13 + lVar30 + sVar10 * sVar11 * uVar26);
                    pfVar2 = (float *)((long)pvVar15 + lVar30 + lVar29);
                    auVar22._4_4_ = pfVar1[1] * pfVar2[1];
                    auVar22._0_4_ = *pfVar1 * *pfVar2;
                    auVar22._8_4_ = pfVar1[2] * pfVar2[2];
                    auVar22._12_4_ = pfVar1[3] * pfVar2[3];
                    auVar22._16_4_ = pfVar1[4] * pfVar2[4];
                    auVar22._20_4_ = pfVar1[5] * pfVar2[5];
                    auVar22._24_4_ = pfVar1[6] * pfVar2[6];
                    auVar22._28_4_ = pfVar1[7];
                    *(undefined1 (*) [32])((long)pvVar15 + lVar30 + lVar29) = auVar22;
                    lVar30 = lVar30 + 0x20;
                    iVar27 = iVar27 + -1;
                  } while (iVar27 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar25);
            }
            uVar23 = uVar23 + 1;
            pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar23 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar24 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      p_Var19 = this->_vptr_Eltwise_x86_avx2[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var19) == 1) {
        pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(int *)(&this->field_0x104 + (long)p_Var19) == 0) {
          if (0 < (int)uVar8) {
            uVar23 = 0;
            do {
              if (0 < iVar31) {
                sVar10 = pMVar24[1].cstep;
                sVar11 = m->cstep;
                sVar12 = m->elemsize;
                pvVar13 = m->data;
                sVar14 = pMVar24[1].elemsize;
                pvVar15 = pMVar24[1].data;
                sVar16 = this_00->cstep;
                sVar17 = this_00->elemsize;
                pvVar18 = this_00->data;
                lVar29 = 0;
                iVar27 = iVar31;
                do {
                  pfVar1 = (float *)((long)pvVar15 + lVar29 + sVar10 * sVar14 * uVar23);
                  pfVar2 = (float *)((long)pvVar13 + lVar29 + sVar11 * sVar12 * uVar23);
                  auVar38._0_4_ = *pfVar1 + *pfVar2;
                  auVar38._4_4_ = pfVar1[1] + pfVar2[1];
                  auVar38._8_4_ = pfVar1[2] + pfVar2[2];
                  auVar38._12_4_ = pfVar1[3] + pfVar2[3];
                  auVar38._16_4_ = pfVar1[4] + pfVar2[4];
                  auVar38._20_4_ = pfVar1[5] + pfVar2[5];
                  auVar38._24_4_ = pfVar1[6] + pfVar2[6];
                  auVar38._28_4_ = pfVar1[7] + pfVar2[7];
                  *(undefined1 (*) [32])((long)pvVar18 + lVar29 + sVar16 * sVar17 * uVar23) =
                       auVar38;
                  lVar29 = lVar29 + 0x20;
                  iVar27 = iVar27 + -1;
                } while (iVar27 != 0);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar25);
          }
          pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (2 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar24 >> 3) *
                         -0x71c71c71c71c71c7)) {
            uVar23 = 2;
            do {
              if (0 < (int)uVar8) {
                pMVar24 = pMVar24 + uVar23;
                uVar26 = 0;
                do {
                  if (0 < iVar31) {
                    sVar10 = pMVar24->cstep;
                    sVar11 = pMVar24->elemsize;
                    pvVar13 = pMVar24->data;
                    lVar29 = this_00->cstep * this_00->elemsize * uVar26;
                    pvVar15 = this_00->data;
                    lVar30 = 0;
                    iVar27 = iVar31;
                    do {
                      pfVar1 = (float *)((long)pvVar13 + lVar30 + sVar10 * sVar11 * uVar26);
                      pfVar2 = (float *)((long)pvVar15 + lVar30 + lVar29);
                      auVar39._0_4_ = *pfVar1 + *pfVar2;
                      auVar39._4_4_ = pfVar1[1] + pfVar2[1];
                      auVar39._8_4_ = pfVar1[2] + pfVar2[2];
                      auVar39._12_4_ = pfVar1[3] + pfVar2[3];
                      auVar39._16_4_ = pfVar1[4] + pfVar2[4];
                      auVar39._20_4_ = pfVar1[5] + pfVar2[5];
                      auVar39._24_4_ = pfVar1[6] + pfVar2[6];
                      auVar39._28_4_ = pfVar1[7] + pfVar2[7];
                      *(undefined1 (*) [32])((long)pvVar15 + lVar30 + lVar29) = auVar39;
                      lVar30 = lVar30 + 0x20;
                      iVar27 = iVar27 + -1;
                    } while (iVar27 != 0);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar25);
              }
              uVar23 = uVar23 + 1;
              pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            } while (uVar23 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar24 >> 3) * -0x71c71c71c71c71c7));
          }
        }
        else {
          if (0 < (int)uVar8) {
            fVar4 = **(float **)(&this->field_0xd8 + (long)p_Var19);
            fVar5 = (*(float **)(&this->field_0xd8 + (long)p_Var19))[1];
            auVar41._4_4_ = fVar5;
            auVar41._0_4_ = fVar5;
            auVar41._8_4_ = fVar5;
            auVar41._12_4_ = fVar5;
            auVar41._16_4_ = fVar5;
            auVar41._20_4_ = fVar5;
            auVar41._24_4_ = fVar5;
            auVar41._28_4_ = fVar5;
            uVar23 = 0;
            do {
              if (0 < iVar31) {
                sVar10 = pMVar24[1].cstep;
                sVar11 = m->cstep;
                sVar12 = m->elemsize;
                pvVar13 = m->data;
                sVar14 = pMVar24[1].elemsize;
                pvVar15 = pMVar24[1].data;
                sVar16 = this_00->cstep;
                sVar17 = this_00->elemsize;
                pvVar18 = this_00->data;
                lVar29 = 0;
                iVar27 = iVar31;
                do {
                  pfVar1 = (float *)((long)pvVar13 + lVar29 + sVar11 * sVar12 * uVar23);
                  auVar43._0_4_ = fVar4 * *pfVar1;
                  auVar43._4_4_ = fVar4 * pfVar1[1];
                  auVar43._8_4_ = fVar4 * pfVar1[2];
                  auVar43._12_4_ = fVar4 * pfVar1[3];
                  auVar43._16_4_ = fVar4 * pfVar1[4];
                  auVar43._20_4_ = fVar4 * pfVar1[5];
                  auVar43._28_36_ = in_ZMM2._28_36_;
                  auVar43._24_4_ = fVar4 * pfVar1[6];
                  auVar32 = vfmadd231ps_fma(auVar43._0_32_,auVar41,
                                            *(undefined1 (*) [32])
                                             ((long)pvVar15 + lVar29 + sVar10 * sVar14 * uVar23));
                  in_ZMM2 = ZEXT1664(auVar32);
                  *(undefined1 (*) [32])((long)pvVar18 + lVar29 + sVar16 * sVar17 * uVar23) =
                       ZEXT1632(auVar32);
                  lVar29 = lVar29 + 0x20;
                  iVar27 = iVar27 + -1;
                } while (iVar27 != 0);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar25);
          }
          pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (2 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar24 >> 3) *
                         -0x71c71c71c71c71c7)) {
            pp_Var20 = this->_vptr_Eltwise_x86_avx2;
            uVar23 = 2;
            do {
              if (0 < (int)uVar8) {
                pMVar24 = pMVar24 + uVar23;
                uVar6 = *(undefined4 *)
                         (*(long *)(&this->field_0xd8 + (long)pp_Var20[-3]) + uVar23 * 4);
                auVar37._4_4_ = uVar6;
                auVar37._0_4_ = uVar6;
                auVar37._8_4_ = uVar6;
                auVar37._12_4_ = uVar6;
                auVar37._16_4_ = uVar6;
                auVar37._20_4_ = uVar6;
                auVar37._24_4_ = uVar6;
                auVar37._28_4_ = uVar6;
                uVar26 = 0;
                do {
                  if (0 < iVar31) {
                    sVar10 = pMVar24->cstep;
                    sVar11 = pMVar24->elemsize;
                    pvVar13 = pMVar24->data;
                    lVar29 = this_00->cstep * this_00->elemsize * uVar26;
                    pvVar15 = this_00->data;
                    lVar30 = 0;
                    iVar27 = iVar31;
                    do {
                      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                                 ((long)pvVar13 + lVar30 + sVar10 * sVar11 * uVar26)
                                                ,auVar37,*(undefined1 (*) [32])
                                                          ((long)pvVar15 + lVar30 + lVar29));
                      *(undefined1 (*) [32])((long)pvVar15 + lVar30 + lVar29) = ZEXT1632(auVar32);
                      lVar30 = lVar30 + 0x20;
                      iVar27 = iVar27 + -1;
                    } while (iVar27 != 0);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar25);
              }
              uVar23 = uVar23 + 1;
              pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            } while (uVar23 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar24 >> 3) * -0x71c71c71c71c71c7));
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx2[-3]) != 2) {
        return 0;
      }
      if (0 < (int)uVar8) {
        pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar23 = 0;
        do {
          if (0 < iVar31) {
            sVar10 = pMVar24[1].cstep;
            sVar11 = m->cstep;
            sVar12 = m->elemsize;
            pvVar13 = m->data;
            sVar14 = pMVar24[1].elemsize;
            pvVar15 = pMVar24[1].data;
            sVar16 = this_00->cstep;
            sVar17 = this_00->elemsize;
            pvVar18 = this_00->data;
            lVar29 = 0;
            iVar27 = iVar31;
            do {
              auVar21 = vmaxps_avx(*(undefined1 (*) [32])
                                    ((long)pvVar13 + lVar29 + sVar11 * sVar12 * uVar23),
                                   *(undefined1 (*) [32])
                                    ((long)pvVar15 + lVar29 + sVar10 * sVar14 * uVar23));
              *(undefined1 (*) [32])((long)pvVar18 + lVar29 + sVar16 * sVar17 * uVar23) = auVar21;
              lVar29 = lVar29 + 0x20;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar25);
      }
      pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar24 >> 3) *
                 -0x71c71c71c71c71c7) < 3) {
        return 0;
      }
      uVar23 = 2;
      do {
        if (0 < (int)uVar8) {
          pMVar24 = pMVar24 + uVar23;
          uVar26 = 0;
          do {
            if (0 < iVar31) {
              sVar10 = pMVar24->cstep;
              sVar11 = pMVar24->elemsize;
              pvVar13 = pMVar24->data;
              lVar29 = this_00->cstep * this_00->elemsize * uVar26;
              pvVar15 = this_00->data;
              lVar30 = 0;
              iVar27 = iVar31;
              do {
                auVar21 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar15 + lVar30 + lVar29),
                                     *(undefined1 (*) [32])
                                      ((long)pvVar13 + lVar30 + sVar10 * sVar11 * uVar26));
                *(undefined1 (*) [32])((long)pvVar15 + lVar30 + lVar29) = auVar21;
                lVar30 = lVar30 + 0x20;
                iVar27 = iVar27 + -1;
              } while (iVar27 != 0);
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar25);
        }
        uVar23 = uVar23 + 1;
        pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar23 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar24 >>
                                3) * -0x71c71c71c71c71c7));
    }
    else {
      if (iVar9 == 0) {
        if (0 < (int)uVar8) {
          pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar23 = 0;
          do {
            if (0 < iVar31) {
              sVar10 = this_00->cstep;
              sVar11 = pMVar24[1].cstep;
              sVar12 = this_00->elemsize;
              pvVar13 = this_00->data;
              sVar14 = pMVar24[1].elemsize;
              pvVar15 = pMVar24[1].data;
              sVar16 = m->cstep;
              sVar17 = m->elemsize;
              pvVar18 = m->data;
              lVar29 = 0;
              iVar27 = iVar31 + 1;
              do {
                *(float *)((long)pvVar13 + lVar29 + sVar10 * sVar12 * uVar23) =
                     *(float *)((long)pvVar15 + lVar29 + sVar11 * sVar14 * uVar23) *
                     *(float *)((long)pvVar18 + lVar29 + sVar16 * sVar17 * uVar23);
                iVar27 = iVar27 + -1;
                lVar29 = lVar29 + 4;
              } while (1 < iVar27);
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar25);
        }
        pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar23 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar24 >> 3) *
                 -0x71c71c71c71c71c7;
        if (2 < uVar23) {
          uVar26 = 2;
          do {
            if (0 < (int)uVar8) {
              pMVar3 = pMVar24 + uVar26;
              uVar28 = 0;
              do {
                if (0 < iVar31) {
                  lVar29 = this_00->cstep * this_00->elemsize * uVar28;
                  pvVar13 = this_00->data;
                  sVar10 = pMVar3->cstep;
                  sVar11 = pMVar3->elemsize;
                  pvVar15 = pMVar3->data;
                  lVar30 = 0;
                  iVar27 = iVar31 + 1;
                  do {
                    *(float *)((long)pvVar13 + lVar30 + lVar29) =
                         *(float *)((long)pvVar13 + lVar30 + lVar29) *
                         *(float *)((long)pvVar15 + lVar30 + sVar10 * sVar11 * uVar28);
                    iVar27 = iVar27 + -1;
                    lVar30 = lVar30 + 4;
                  } while (1 < iVar27);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar25);
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar23);
        }
      }
      p_Var19 = this->_vptr_Eltwise_x86_avx2[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var19) == 1) {
        pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(int *)(&this->field_0x104 + (long)p_Var19) == 0) {
          if (0 < (int)uVar8) {
            uVar23 = 0;
            do {
              if (0 < iVar31) {
                sVar10 = this_00->cstep;
                sVar11 = pMVar24[1].cstep;
                sVar12 = this_00->elemsize;
                pvVar13 = this_00->data;
                sVar14 = pMVar24[1].elemsize;
                pvVar15 = pMVar24[1].data;
                sVar16 = m->cstep;
                sVar17 = m->elemsize;
                pvVar18 = m->data;
                lVar29 = 0;
                iVar27 = iVar31 + 1;
                do {
                  *(float *)((long)pvVar13 + lVar29 + sVar10 * sVar12 * uVar23) =
                       *(float *)((long)pvVar15 + lVar29 + sVar11 * sVar14 * uVar23) +
                       *(float *)((long)pvVar18 + lVar29 + sVar16 * sVar17 * uVar23);
                  iVar27 = iVar27 + -1;
                  lVar29 = lVar29 + 4;
                } while (1 < iVar27);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar25);
          }
          pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar23 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar24 >> 3) *
                   -0x71c71c71c71c71c7;
          if (2 < uVar23) {
            uVar26 = 2;
            do {
              if (0 < (int)uVar8) {
                pMVar3 = pMVar24 + uVar26;
                uVar28 = 0;
                do {
                  if (0 < iVar31) {
                    lVar29 = this_00->cstep * this_00->elemsize * uVar28;
                    pvVar13 = this_00->data;
                    sVar10 = pMVar3->cstep;
                    sVar11 = pMVar3->elemsize;
                    pvVar15 = pMVar3->data;
                    lVar30 = 0;
                    iVar27 = iVar31 + 1;
                    do {
                      *(float *)((long)pvVar13 + lVar30 + lVar29) =
                           *(float *)((long)pvVar13 + lVar30 + lVar29) +
                           *(float *)((long)pvVar15 + lVar30 + sVar10 * sVar11 * uVar28);
                      iVar27 = iVar27 + -1;
                      lVar30 = lVar30 + 4;
                    } while (1 < iVar27);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar25);
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar23);
          }
        }
        else {
          if (0 < (int)uVar8) {
            fVar4 = **(float **)(&this->field_0xd8 + (long)p_Var19);
            fVar5 = (*(float **)(&this->field_0xd8 + (long)p_Var19))[1];
            uVar23 = 0;
            do {
              if (0 < iVar31) {
                sVar10 = this_00->cstep;
                sVar11 = pMVar24[1].cstep;
                sVar12 = this_00->elemsize;
                pvVar13 = this_00->data;
                sVar14 = pMVar24[1].elemsize;
                pvVar15 = pMVar24[1].data;
                sVar16 = m->cstep;
                sVar17 = m->elemsize;
                pvVar18 = m->data;
                lVar29 = 0;
                iVar27 = iVar31 + 1;
                do {
                  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * *(float *)((long)pvVar18 +
                                                                             lVar29 + sVar16 * 
                                                  sVar17 * uVar23))),ZEXT416((uint)fVar5),
                                            ZEXT416(*(uint *)((long)pvVar15 +
                                                             lVar29 + sVar11 * sVar14 * uVar23)));
                  *(int *)((long)pvVar13 + lVar29 + sVar10 * sVar12 * uVar23) = auVar32._0_4_;
                  iVar27 = iVar27 + -1;
                  lVar29 = lVar29 + 4;
                } while (1 < iVar27);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar25);
          }
          pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar23 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar24 >> 3) *
                   -0x71c71c71c71c71c7;
          if (2 < uVar23) {
            pp_Var20 = this->_vptr_Eltwise_x86_avx2;
            uVar26 = 2;
            do {
              if (0 < (int)uVar8) {
                pMVar3 = pMVar24 + uVar26;
                uVar7 = *(uint *)(*(long *)(&this->field_0xd8 + (long)pp_Var20[-3]) + uVar26 * 4);
                uVar28 = 0;
                do {
                  if (0 < iVar31) {
                    lVar29 = this_00->cstep * this_00->elemsize * uVar28;
                    pvVar13 = this_00->data;
                    sVar10 = pMVar3->cstep;
                    sVar11 = pMVar3->elemsize;
                    pvVar15 = pMVar3->data;
                    lVar30 = 0;
                    iVar27 = iVar31 + 1;
                    do {
                      auVar32 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pvVar15 +
                                                                 lVar30 + sVar10 * sVar11 * uVar28))
                                                ,ZEXT416(uVar7),
                                                ZEXT416(*(uint *)((long)pvVar13 + lVar30 + lVar29)))
                      ;
                      *(int *)((long)pvVar13 + lVar30 + lVar29) = auVar32._0_4_;
                      iVar27 = iVar27 + -1;
                      lVar30 = lVar30 + 4;
                    } while (1 < iVar27);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar25);
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar23);
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx2[-3]) != 2) {
        return 0;
      }
      if (0 < (int)uVar8) {
        pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar23 = 0;
        do {
          if (0 < iVar31) {
            sVar10 = this_00->cstep;
            sVar11 = pMVar24[1].cstep;
            sVar12 = this_00->elemsize;
            pvVar13 = this_00->data;
            sVar14 = pMVar24[1].elemsize;
            pvVar15 = pMVar24[1].data;
            sVar16 = m->cstep;
            sVar17 = m->elemsize;
            pvVar18 = m->data;
            lVar29 = 0;
            iVar27 = iVar31 + 1;
            do {
              auVar32 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar15 +
                                                    lVar29 + sVar11 * sVar14 * uVar23)),
                                   ZEXT416(*(uint *)((long)pvVar18 +
                                                    lVar29 + sVar16 * sVar17 * uVar23)));
              *(int *)((long)pvVar13 + lVar29 + sVar10 * sVar12 * uVar23) = auVar32._0_4_;
              iVar27 = iVar27 + -1;
              lVar29 = lVar29 + 4;
            } while (1 < iVar27);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar25);
      }
      pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar23 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar24 >> 3) *
               -0x71c71c71c71c71c7;
      if (uVar23 < 3) {
        return 0;
      }
      uVar26 = 2;
      do {
        if (0 < (int)uVar8) {
          pMVar3 = pMVar24 + uVar26;
          uVar28 = 0;
          do {
            if (0 < iVar31) {
              lVar29 = this_00->cstep * this_00->elemsize * uVar28;
              pvVar13 = this_00->data;
              sVar10 = pMVar3->cstep;
              sVar11 = pMVar3->elemsize;
              pvVar15 = pMVar3->data;
              lVar30 = 0;
              iVar27 = iVar31 + 1;
              do {
                auVar32 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar13 + lVar30 + lVar29)),
                                     ZEXT416(*(uint *)((long)pvVar15 +
                                                      lVar30 + sVar10 * sVar11 * uVar28)));
                *(int *)((long)pvVar13 + lVar30 + lVar29) = auVar32._0_4_;
                iVar27 = iVar27 + -1;
                lVar30 = lVar30 + 4;
              } while (1 < iVar27);
            }
            uVar28 = uVar28 + 1;
          } while (uVar28 != uVar25);
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar23);
    }
    return 0;
  }
  return -100;
}

Assistant:

int Eltwise_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_add_ps(_p, _p1);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m256 _coeff0 = _mm256_set1_ps(coeffs[0]);
                __m256 _coeff1 = _mm256_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_mul_ps(_p, _coeff0);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff1, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m256 _coeff = _mm256_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_comp_fmadd_ps(_p1, _coeff, _p);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_max_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p = _mm_load_ps(outptr);
                            __m128 _p1 = _mm_load_ps(ptr);
                            _p = _mm_add_ps(_p, _p1);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m128 _coeff0 = _mm_set1_ps(coeffs[0]);
                __m128 _coeff1 = _mm_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_mul_ps(_p, _coeff0);
                        _p1 = _mm_mul_ps(_p1, _coeff1);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m128 _coeff = _mm_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p1 = _mm_load_ps(ptr);
                            __m128 _p = _mm_load_ps(outptr);
                            _p1 = _mm_mul_ps(_p1, _coeff);
                            _p = _mm_add_ps(_p1, _p);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_max_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}